

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O0

int resampler_run_cubic_sse(resampler *r,float **out_,float *out_end)

{
  unsigned_long_long uVar1;
  int iVar2;
  undefined8 *puVar3;
  ulong uVar4;
  long lVar5;
  ulong local_130;
  undefined8 *local_120;
  float *local_118;
  int local_10c;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  __m128 samplex;
  __m128 temp2;
  __m128 temp1;
  bigint phase_inc;
  bigint phase;
  float *in_end;
  float *in;
  float *out;
  int used;
  float *in_;
  int in_size;
  float *out_end_local;
  float **out__local;
  
  puVar3 = (undefined8 *)((long)r + (long)r->write_filled * -4 + (long)r->write_pos * 4 + 0x148);
  local_10c = 0;
  iVar2 = r->write_filled + -4;
  if (0 < iVar2) {
    local_118 = *out_;
    local_130 = (r->phase).quad;
    uVar1 = (r->phase_inc).quad;
    local_120 = puVar3;
    do {
      if (out_end <= local_118) break;
      lVar5 = (long)((int)(local_130 >> 0x16) << 2);
      local_c8 = (float)*local_120;
      fStack_c4 = (float)((ulong)*local_120 >> 0x20);
      fStack_c0 = (float)local_120[1];
      fStack_bc = (float)((ulong)local_120[1] >> 0x20);
      local_d8 = (float)*(undefined8 *)(cubic_lut + lVar5);
      fStack_d4 = (float)((ulong)*(undefined8 *)(cubic_lut + lVar5) >> 0x20);
      fStack_d0 = (float)*(undefined8 *)(cubic_lut + lVar5 + 2);
      fStack_cc = (float)((ulong)*(undefined8 *)(cubic_lut + lVar5 + 2) >> 0x20);
      *local_118 = local_c8 * local_d8 + 0.0 + fStack_c0 * fStack_d0 + 0.0 +
                   fStack_c4 * fStack_d4 + 0.0 + fStack_bc * fStack_cc + 0.0;
      local_118 = local_118 + 1;
      uVar4 = uVar1 + local_130;
      local_120 = (undefined8 *)((long)local_120 + (uVar4 >> 0x20) * 4);
      local_130 = uVar4 & 0xffffffff;
    } while (local_120 < (undefined8 *)((long)puVar3 + (long)iVar2 * 4));
    (r->phase).quad = local_130;
    *out_ = local_118;
    local_10c = (int)((long)local_120 - (long)puVar3 >> 2);
    r->write_filled = r->write_filled - local_10c;
  }
  return local_10c;
}

Assistant:

static int resampler_run_cubic_sse(resampler * r, float ** out_, float * out_end)
{
    int in_size = r->write_filled;
    float const* in_ = r->buffer_in + resampler_buffer_size + r->write_pos - r->write_filled;
    int used = 0;
    in_size -= 4;
    if ( in_size > 0 )
    {
        float* out = *out_;
        float const* in = in_;
        float const* const in_end = in + in_size;
        bigint phase = r->phase;
        bigint phase_inc = r->phase_inc;

        do
        {
            __m128 temp1, temp2;
            __m128 samplex = _mm_setzero_ps();
            
            if ( out >= out_end )
                break;
            
            temp1 = _mm_loadu_ps( (const float *)( in ) );
            temp2 = _mm_load_ps( (const float *)( cubic_lut + PHASE_REDUCE(phase) * 4 ) );
            temp1 = _mm_mul_ps( temp1, temp2 );
            samplex = _mm_add_ps( samplex, temp1 );
            temp1 = _mm_movehl_ps( temp1, samplex );
            samplex = _mm_add_ps( samplex, temp1 );
            temp1 = samplex;
            temp1 = _mm_shuffle_ps( temp1, samplex, _MM_SHUFFLE(0, 0, 0, 1) );
            samplex = _mm_add_ps( samplex, temp1 );
            _mm_store_ss( out, samplex );
            ++out;
            
            phase.quad += phase_inc.quad;
            
            ADD_HI(in, phase);
            
            CLEAR_HI(phase);
        }
        while ( in < in_end );
        
        r->phase = phase;
        *out_ = out;
        
        used = (int)(in - in_);
        
        r->write_filled -= used;
    }
    
    return used;
}